

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O1

void __thiscall QAction::~QAction(QAction *this)

{
  int id;
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  QShortcutMap *this_00;
  long in_FS_OFFSET;
  QKeySequence local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007f0e18;
  plVar1 = *(long **)&this->field_0x8;
  (**(code **)(*plVar1 + 0x20))(plVar1);
  if (((plVar1[0xf] != 0) && (*(int *)(plVar1[0xf] + 4) != 0)) && (plVar1[0x10] != 0)) {
    QActionGroup::removeAction((QActionGroup *)plVar1[0x10],this);
  }
  if ((QCoreApplication::self != 0) && (lVar2 = plVar1[0x2d], lVar2 != 0)) {
    lVar3 = plVar1[0x2c];
    lVar4 = 0;
    do {
      id = *(int *)(lVar3 + lVar4);
      if (id != 0) {
        this_00 = &QGuiApplicationPrivate::self->shortcutMap;
        QKeySequence::QKeySequence(&local_40);
        QShortcutMap::removeShortcut(this_00,id,&this->super_QObject,&local_40);
        QKeySequence::~QKeySequence(&local_40);
      }
      lVar4 = lVar4 + 4;
    } while (lVar2 << 2 != lVar4);
  }
  QObject::~QObject(&this->super_QObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAction::~QAction()
{
    Q_D(QAction);

    d->destroy();

    if (d->group)
        d->group->removeAction(this);
#if QT_CONFIG(shortcut)
    if (qApp) {
        for (int id : std::as_const(d->shortcutIds)) {
            if (id)
                QGuiApplicationPrivate::instance()->shortcutMap.removeShortcut(id, this);
        }
    }
#endif
}